

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O3

TypedDeleter<LLVMBC::FunctionType> * __thiscall
LLVMBC::LLVMContext::
construct_trivial<LLVMBC::LLVMContext::TypedDeleter<LLVMBC::FunctionType>,LLVMBC::FunctionType*&>
          (LLVMContext *this,FunctionType **u)

{
  FunctionType *pFVar1;
  TypedDeleter<LLVMBC::FunctionType> *pTVar2;
  
  pTVar2 = (TypedDeleter<LLVMBC::FunctionType> *)allocate(this,0x10,8);
  if (pTVar2 != (TypedDeleter<LLVMBC::FunctionType> *)0x0) {
    pFVar1 = *u;
    (pTVar2->super_Deleter)._vptr_Deleter = (_func_int **)&PTR__Deleter_001f3a40;
    pTVar2->ptr = pFVar1;
    return pTVar2;
  }
  std::terminate();
}

Assistant:

T *construct_trivial(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);
		return t;
	}